

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O3

void vidpalset(ubyte iobyte)

{
  ulong uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = CONCAT71(in_register_00000039,iobyte) >> 4 & 0xfffffff;
  vidpal[uVar1] = iobyte & 0xf;
  setpalette((ubyte)uVar1,
             (&DAT_0010e204)[(ulong)((uint)CONCAT71(in_register_00000039,iobyte) & 0xf) ^ 7]);
  return;
}

Assistant:

void vidpalset(ubyte iobyte)     // video palette update functions
{
    ubyte logical_colour;
    ubyte actual_colour;
    ubyte pc_colour;

    logical_colour = iobyte / 0x10;   // calculate logical colour
    actual_colour = iobyte & 0xF;     // calculate actual programmed colour

    vidpal[logical_colour] = actual_colour;  // update vidpal copy of palette

    switch (actual_colour ^ 0x7)              // convert actual colour to
    {                                      // pc colour
        case 0:
            pc_colour = EGA_BLACK;
            break;
        case 1:
            pc_colour = EGA_RED;
            break;
        case 2:
            pc_colour = EGA_GREEN;
            break;
        case 3:
            pc_colour = EGA_YELLOW;
            break;
        case 4:
            pc_colour = EGA_BLUE;
            break;
        case 5:
            pc_colour = EGA_MAGENTA;
            break;
        case 6:
            pc_colour = EGA_CYAN;
            break;
        case 7:
            pc_colour = EGA_WHITE;
            break;

        case 8:
            pc_colour = EGA_BLACK;
            break;
        case 9:
            pc_colour = EGA_RED;
            break;
        case 10:
            pc_colour = EGA_GREEN;
            break;
        case 11:
            pc_colour = EGA_YELLOW;
            break;
        case 12:
            pc_colour = EGA_BLUE;
            break;
        case 13:
            pc_colour = EGA_MAGENTA;
            break;
        case 14:
            pc_colour = EGA_CYAN;
            break;
        case 15:
            pc_colour = EGA_WHITE;
            break;

    }

    setpalette(logical_colour, pc_colour); // update pc palette
}